

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mqtt_client.c
# Opt level: O1

void recvCompleteCallback
               (void *context,CONTROL_PACKET_TYPE packet,int flags,BUFFER_HANDLE headerData)

{
  byte *pbVar1;
  byte *__src;
  QOS_VALUE qosValue;
  uint16_t uVar2;
  int iVar3;
  uint uVar4;
  byte *pbVar5;
  LOGGER_LOG UNRECOVERED_JUMPTABLE;
  code *pcVar6;
  STRING_HANDLE pSVar7;
  BUFFER_HANDLE handle;
  size_t length;
  uchar *data;
  MQTT_MESSAGE_HANDLE handle_00;
  undefined8 uVar8;
  char *pcVar9;
  byte bVar10;
  undefined8 *puVar11;
  byte bVar12;
  undefined8 uVar13;
  char *pcVar14;
  char *pcVar15;
  ulong uVar16;
  long lVar17;
  uint8_t *iterator;
  PUBLISH_ACK publish_ack;
  STRING_HANDLE local_68;
  byte *local_60;
  undefined8 local_58;
  char *pcStack_50;
  long local_48;
  QOS_VALUE local_3c;
  uint local_38;
  uint local_34;
  
  if (context == (void *)0x0) {
    UNRECOVERED_JUMPTABLE = xlogging_get_log_function();
    if (UNRECOVERED_JUMPTABLE == (LOGGER_LOG)0x0) {
      return;
    }
    (*UNRECOVERED_JUMPTABLE)
              (AZ_LOG_ERROR,
               "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-umqtt-c/src/mqtt_client.c"
               ,"recvCompleteCallback",0x3f1,1,"recvCompleteCallback context failed.");
    return;
  }
  local_60 = (byte *)0x0;
  if (headerData == (BUFFER_HANDLE)0x0) {
    pbVar5 = (byte *)0x0;
  }
  else {
    pbVar5 = (byte *)BUFFER_length(headerData);
    local_60 = BUFFER_u_char(headerData);
  }
  pbVar1 = local_60;
  if ((packet != PINGRESP_TYPE) && (local_60 == (byte *)0x0 || pbVar5 == (byte *)0x0)) {
    return;
  }
  switch(packet << 0x1c | (uint)(packet + 0xffffffe0) >> 4) {
  case PACKET_INVALID1_TYPE:
    local_58 = (byte *)0x0;
    if (pbVar5 == (byte *)0x2) {
      bVar12 = *local_60;
      if (bVar12 < 2) {
        pbVar5 = local_60 + 1;
        local_60 = local_60 + 2;
        bVar10 = 6;
        if (*pbVar5 < 6) {
          bVar10 = *pbVar5;
        }
        local_58._0_4_ = (uint)(bVar12 == 1);
        local_58 = (byte *)(ulong)CONCAT14(bVar10,(uint)local_58);
        if ((*(byte *)((long)context + 0xa2) & 1) != 0) {
          pcVar15 = "false";
          if (bVar12 == 1) {
            pcVar15 = "true";
          }
          pSVar7 = STRING_construct_sprintf
                             ("CONNACK | SESSION_PRESENT: %s | RETURN_CODE: 0x%x",pcVar15);
          log_incoming_trace((MQTT_CLIENT *)context,pSVar7);
          STRING_delete(pSVar7);
        }
        (**(code **)((long)context + 0x28))
                  (context,1,&local_58,*(undefined8 *)((long)context + 0x38));
        if (local_58._4_4_ != 0) {
          return;
        }
        *(byte *)((long)context + 0xa0) = *(byte *)((long)context + 0xa0) | 1;
        return;
      }
      local_60 = local_60 + 1;
      UNRECOVERED_JUMPTABLE = xlogging_get_log_function();
      if (UNRECOVERED_JUMPTABLE != (LOGGER_LOG)0x0) {
        pcVar15 = "Invalid CONNACK packet.";
        iVar3 = 0x32b;
LAB_001126a2:
        (*UNRECOVERED_JUMPTABLE)
                  (AZ_LOG_ERROR,
                   "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-umqtt-c/src/mqtt_client.c"
                   ,"recvCompleteCallback",iVar3,1,pcVar15);
      }
    }
    else {
      UNRECOVERED_JUMPTABLE = xlogging_get_log_function();
      if (UNRECOVERED_JUMPTABLE != (LOGGER_LOG)0x0) {
        pcVar15 = "Invalid CONNACK packet.";
        iVar3 = 0x323;
        goto LAB_001126a2;
      }
    }
    break;
  case 1:
    local_3c = (uint)((flags & 2U) == 0) + DELIVER_AT_LEAST_ONCE;
    if (flags == 0) {
      local_3c = DELIVER_AT_MOST_ONCE;
    }
    local_58 = local_60;
    uVar2 = byteutil_read_uint16((uint8_t **)&local_58,(size_t)pbVar5);
    __src = local_58;
    if ((uVar2 == 0) || (uVar16 = (ulong)uVar2, pbVar5 < local_58 + (uVar16 - (long)pbVar1))) {
      UNRECOVERED_JUMPTABLE = xlogging_get_log_function();
      if (UNRECOVERED_JUMPTABLE != (LOGGER_LOG)0x0) {
        pcVar14 = "String passed not a valid UTF.";
        iVar3 = 0xbd;
        goto LAB_001128ae;
      }
LAB_00112d71:
      pcVar15 = (char *)0x0;
    }
    else {
      pcVar15 = (char *)malloc(uVar16 + 1);
      if (pcVar15 == (char *)0x0) {
        UNRECOVERED_JUMPTABLE = xlogging_get_log_function();
        if (UNRECOVERED_JUMPTABLE == (LOGGER_LOG)0x0) goto LAB_00112d71;
        pcVar14 = "Cannot alloc memory, size:%zu";
        iVar3 = 0xb8;
LAB_001128ae:
        pcVar15 = (char *)0x0;
        (*UNRECOVERED_JUMPTABLE)
                  (AZ_LOG_ERROR,
                   "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-umqtt-c/src/mqtt_client.c"
                   ,"byteutil_readUTF",iVar3,1,pcVar14);
      }
      else {
        memcpy(pcVar15,__src,uVar16);
        pcVar15[uVar16] = '\0';
        local_58 = __src + uVar16;
      }
    }
    if (pcVar15 != (char *)0x0) {
      local_34 = flags & 1;
      if ((*(byte *)((long)context + 0xa2) & 1) == 0) {
        local_68 = (STRING_HANDLE)0x0;
      }
      else {
        pcVar14 = "false";
        if ((flags & 8U) != 0) {
          pcVar14 = "true";
        }
        lVar17 = 0;
        pcVar9 = "NULL";
        do {
          if (*(QOS_VALUE *)((long)&QOS_VALUE_ValuesAndStrings[0].value + lVar17) == local_3c) {
            pcVar9 = *(char **)((long)&QOS_VALUE_ValuesAndStrings[0].valueAsString + lVar17);
            break;
          }
          lVar17 = lVar17 + 0x10;
        } while (lVar17 != 0x40);
        local_68 = STRING_construct_sprintf
                             ("PUBLISH | IS_DUP: %s | RETAIN: %d | QOS: %s | TOPIC_NAME: %s",pcVar14
                              ,(ulong)local_34,pcVar9,pcVar15);
      }
      if (flags == 0) {
        uVar4 = 0;
      }
      else {
        uVar2 = byteutil_read_uint16
                          ((uint8_t **)&local_58,(long)(pbVar5 + (long)pbVar1) - (long)local_58);
        uVar4 = (uint)uVar2;
        if ((*(byte *)((long)context + 0xa2) & 1) != 0) {
          STRING_sprintf(local_68," | PACKET_ID: %u",(ulong)uVar4);
        }
      }
      qosValue = local_3c;
      if ((flags == 0) || ((uint16_t)uVar4 != 0)) {
        lVar17 = (long)pbVar1 - (long)local_58;
        local_38 = uVar4;
        handle_00 = mqttmessage_create_in_place
                              ((uint16_t)uVar4,pcVar15,local_3c,local_58,(size_t)(pbVar5 + lVar17));
        if (handle_00 == (MQTT_MESSAGE_HANDLE)0x0) {
          UNRECOVERED_JUMPTABLE = xlogging_get_log_function();
          if (UNRECOVERED_JUMPTABLE != (LOGGER_LOG)0x0) {
            (*UNRECOVERED_JUMPTABLE)
                      (AZ_LOG_ERROR,
                       "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-umqtt-c/src/mqtt_client.c"
                       ,"ProcessPublishMessage",0x2e4,1,"failure in mqttmessage_create");
          }
          pcVar6 = *(code **)((long)context + 0x40);
joined_r0x00113004:
          if (pcVar6 != (code *)0x0) {
            (*pcVar6)(context,3,*(undefined8 *)((long)context + 0x48));
          }
          close_connection((MQTT_CLIENT *)context);
        }
        else {
          iVar3 = mqttmessage_setIsDuplicateMsg(handle_00,SUB41((flags & 8U) >> 3,0));
          if ((iVar3 != 0) ||
             (iVar3 = mqttmessage_setIsRetained(handle_00,SUB41(local_34,0)), iVar3 != 0)) {
            UNRECOVERED_JUMPTABLE = xlogging_get_log_function();
            if (UNRECOVERED_JUMPTABLE != (LOGGER_LOG)0x0) {
              (*UNRECOVERED_JUMPTABLE)
                        (AZ_LOG_ERROR,
                         "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-umqtt-c/src/mqtt_client.c"
                         ,"ProcessPublishMessage",0x2ea,1,"failure setting mqtt message property");
            }
            pcVar6 = *(code **)((long)context + 0x40);
            goto joined_r0x00113004;
          }
          if ((*(byte *)((long)context + 0xa2) & 1) != 0) {
            STRING_sprintf(local_68," | PAYLOAD_LEN: %lu",pbVar5 + lVar17);
            log_incoming_trace((MQTT_CLIENT *)context,local_68);
          }
          iVar3 = (**(code **)((long)context + 0x30))
                            (handle_00,*(undefined8 *)((long)context + 0x38));
          if (iVar3 == 1) {
            SendMessageAck((MQTT_CLIENT *)context,(uint16_t)local_38,qosValue);
          }
        }
        mqttmessage_destroy(handle_00);
      }
      else {
        UNRECOVERED_JUMPTABLE = xlogging_get_log_function();
        if (UNRECOVERED_JUMPTABLE != (LOGGER_LOG)0x0) {
          (*UNRECOVERED_JUMPTABLE)
                    (AZ_LOG_ERROR,
                     "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-umqtt-c/src/mqtt_client.c"
                     ,"ProcessPublishMessage",0x2da,1,"Publish MSG: packetId=0, invalid");
        }
        if (*(code **)((long)context + 0x40) != (code *)0x0) {
          (**(code **)((long)context + 0x40))(context,2,*(undefined8 *)((long)context + 0x48));
        }
        close_connection((MQTT_CLIENT *)context);
      }
      if (local_68 != (STRING_HANDLE)0x0) {
        STRING_delete(local_68);
      }
LAB_00112fb0:
      free(pcVar15);
      return;
    }
    UNRECOVERED_JUMPTABLE = xlogging_get_log_function();
    if (UNRECOVERED_JUMPTABLE != (LOGGER_LOG)0x0) {
      (*UNRECOVERED_JUMPTABLE)
                (AZ_LOG_ERROR,
                 "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-umqtt-c/src/mqtt_client.c"
                 ,"ProcessPublishMessage",0x2be,1,"Publish MSG: failure reading topic name");
    }
    pcVar6 = *(code **)((long)context + 0x40);
    if (pcVar6 == (code *)0x0) goto LAB_001126c4;
    uVar8 = *(undefined8 *)((long)context + 0x48);
    uVar13 = 2;
    goto LAB_001126c2;
  case 2:
  case 3:
  case 4:
  case 5:
    if (pbVar5 == (byte *)0x2) {
      bVar12 = 2;
      if ((packet != PUBACK_TYPE) && (bVar12 = 3, packet != PUBREC_TYPE)) {
        bVar12 = packet == PUBREL_TYPE ^ 5;
      }
      local_58 = (byte *)((ulong)local_58._2_6_ << 0x10);
      uVar2 = byteutil_read_uint16(&local_60,2);
      local_58 = (byte *)CONCAT62(local_58._2_6_,uVar2);
      if ((*(byte *)((long)context + 0xa2) & 1) != 0) {
        if (packet == PUBACK_TYPE) {
          pcVar15 = "PUBACK";
        }
        else if (packet == PUBREC_TYPE) {
          pcVar15 = "PUBREC";
        }
        else {
          pcVar15 = "PUBCOMP";
          if (packet == PUBREL_TYPE) {
            pcVar15 = "PUBREL";
          }
        }
        pSVar7 = STRING_construct_sprintf("%s | PACKET_ID: %u",pcVar15,(ulong)uVar2);
        log_incoming_trace((MQTT_CLIENT *)context,pSVar7);
        STRING_delete(pSVar7);
      }
      (**(code **)((long)context + 0x28))
                (context,bVar12,&local_58,*(undefined8 *)((long)context + 0x38));
      if (packet == PUBREL_TYPE) {
        handle = mqtt_codec_publishComplete((uint16_t)local_58);
        if (handle != (BUFFER_HANDLE)0x0) goto LAB_00112c77;
        UNRECOVERED_JUMPTABLE = xlogging_get_log_function();
        if (UNRECOVERED_JUMPTABLE != (LOGGER_LOG)0x0) {
          pcVar15 = "Failed to allocate publish complete message.";
          iVar3 = 0x379;
LAB_00112c4a:
          (*UNRECOVERED_JUMPTABLE)
                    (AZ_LOG_ERROR,
                     "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-umqtt-c/src/mqtt_client.c"
                     ,"recvCompleteCallback",iVar3,1,pcVar15);
        }
LAB_00112c55:
        if (*(code **)((long)context + 0x40) != (code *)0x0) {
          (**(code **)((long)context + 0x40))(context,3,*(undefined8 *)((long)context + 0x48));
        }
        close_connection((MQTT_CLIENT *)context);
      }
      else if (packet == PUBREC_TYPE) {
        handle = mqtt_codec_publishRelease((uint16_t)local_58);
        if (handle != (BUFFER_HANDLE)0x0) goto LAB_00112c77;
        UNRECOVERED_JUMPTABLE = xlogging_get_log_function();
        if (UNRECOVERED_JUMPTABLE != (LOGGER_LOG)0x0) {
          pcVar15 = "Failed to allocate publish release message.";
          iVar3 = 0x370;
          goto LAB_00112c4a;
        }
        goto LAB_00112c55;
      }
      handle = (BUFFER_HANDLE)0x0;
LAB_00112c77:
      if (handle == (BUFFER_HANDLE)0x0) {
        return;
      }
      length = BUFFER_length(handle);
      data = BUFFER_u_char(handle);
      iVar3 = sendPacketItem((MQTT_CLIENT *)context,data,length);
      if (iVar3 != 0) {
        UNRECOVERED_JUMPTABLE = xlogging_get_log_function();
        if (UNRECOVERED_JUMPTABLE != (LOGGER_LOG)0x0) {
          (*UNRECOVERED_JUMPTABLE)
                    (AZ_LOG_ERROR,
                     "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-umqtt-c/src/mqtt_client.c"
                     ,"recvCompleteCallback",0x382,1,"Failed sending publish reply.");
        }
        if (*(code **)((long)context + 0x40) != (code *)0x0) {
          (**(code **)((long)context + 0x40))(context,4,*(undefined8 *)((long)context + 0x48));
        }
        close_connection((MQTT_CLIENT *)context);
      }
      BUFFER_delete(handle);
      return;
    }
    UNRECOVERED_JUMPTABLE = xlogging_get_log_function();
    if (UNRECOVERED_JUMPTABLE != (LOGGER_LOG)0x0) {
      pcVar15 = "Invalid packet length.";
      iVar3 = 0x352;
      goto LAB_001126a2;
    }
    break;
  default:
    goto switchD_00112610_caseD_6;
  case 7:
    local_58 = (uint8_t *)0x0;
    pcStack_50 = (char *)0x0;
    local_48 = 0;
    uVar2 = byteutil_read_uint16(&local_60,(size_t)pbVar5);
    local_58 = (byte *)CONCAT62(local_58._2_6_,uVar2);
    pbVar5 = pbVar5 + -2;
    if ((*(byte *)((long)context + 0xa2) & 1) == 0) {
      pSVar7 = (STRING_HANDLE)0x0;
    }
    else {
      pSVar7 = STRING_construct_sprintf("SUBACK | PACKET_ID: %u",(ulong)uVar2);
    }
    uVar16 = -(ulong)((ulong)pbVar5 >> 0x3e != 0) | (long)pbVar5 * 4;
    if (((ulong)pbVar5 >> 0x3e == 0) &&
       (pcStack_50 = (char *)malloc(uVar16), pcStack_50 != (char *)0x0)) {
      do {
        if (pbVar5 == (byte *)0x0) break;
        bVar12 = *local_60;
        local_60 = local_60 + 1;
        if ((bVar12 & 0x7c) == 0) {
          uVar4 = 0x80;
          if (bVar12 < 3) {
            uVar4 = (uint)bVar12;
          }
          *(uint *)(pcStack_50 + local_48 * 4) = uVar4;
          pbVar5 = pbVar5 + -1;
          lVar17 = local_48 + 1;
          if ((*(byte *)((long)context + 0xa2) & 1) != 0) {
            lVar17 = local_48 * 4;
            local_48 = local_48 + 1;
            STRING_sprintf(pSVar7," | RETURN_CODE: %u",(ulong)*(uint *)(pcStack_50 + lVar17));
            lVar17 = local_48;
          }
        }
        else {
          UNRECOVERED_JUMPTABLE = xlogging_get_log_function();
          if (UNRECOVERED_JUMPTABLE != (LOGGER_LOG)0x0) {
            (*UNRECOVERED_JUMPTABLE)
                      (AZ_LOG_ERROR,
                       "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-umqtt-c/src/mqtt_client.c"
                       ,"recvCompleteCallback",0x3a4,1,"Invalid SUBACK_TYPE packet.");
          }
          if (*(code **)((long)context + 0x40) != (code *)0x0) {
            (**(code **)((long)context + 0x40))(context,4,*(undefined8 *)((long)context + 0x48));
          }
          close_connection((MQTT_CLIENT *)context);
          lVar17 = local_48;
        }
        local_48 = lVar17;
      } while ((bVar12 & 0x7c) == 0);
      if ((*(byte *)((long)context + 0xa2) & 1) != 0) {
        log_incoming_trace((MQTT_CLIENT *)context,pSVar7);
        STRING_delete(pSVar7);
      }
      (**(code **)((long)context + 0x28))(context,6,&local_58,*(undefined8 *)((long)context + 0x38))
      ;
      pcVar15 = pcStack_50;
      goto LAB_00112fb0;
    }
    UNRECOVERED_JUMPTABLE = xlogging_get_log_function();
    if (UNRECOVERED_JUMPTABLE != (LOGGER_LOG)0x0) {
      (*UNRECOVERED_JUMPTABLE)
                (AZ_LOG_ERROR,
                 "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-umqtt-c/src/mqtt_client.c"
                 ,"recvCompleteCallback",0x3c0,1,
                 "allocation of quality of service value failed, size:%zu",uVar16);
    }
    pcVar6 = *(code **)((long)context + 0x40);
    if (pcVar6 != (code *)0x0) {
      uVar8 = *(undefined8 *)((long)context + 0x48);
      uVar13 = 3;
      goto LAB_001126c2;
    }
    goto LAB_001126c4;
  case 9:
    local_58 = (byte *)((ulong)local_58._2_6_ << 0x10);
    if (pbVar5 == (byte *)0x2) {
      uVar2 = byteutil_read_uint16(&local_60,2);
      local_58 = (byte *)CONCAT62(local_58._2_6_,uVar2);
      if ((*(byte *)((long)context + 0xa2) & 1) != 0) {
        pSVar7 = STRING_construct_sprintf("UNSUBACK | PACKET_ID: %u",(ulong)uVar2);
        log_incoming_trace((MQTT_CLIENT *)context,pSVar7);
        STRING_delete(pSVar7);
      }
      uVar8 = *(undefined8 *)((long)context + 0x38);
      puVar11 = &local_58;
      uVar13 = 7;
      goto LAB_00112904;
    }
    UNRECOVERED_JUMPTABLE = xlogging_get_log_function();
    if (UNRECOVERED_JUMPTABLE != (LOGGER_LOG)0x0) {
      pcVar15 = "Invalid UNSUBACK packet length.";
      iVar3 = 0x3cb;
      goto LAB_001126a2;
    }
    break;
  case 0xb:
    *(undefined8 *)((long)context + 0xa8) = 0;
    if ((*(byte *)((long)context + 0xa2) & 1) != 0) {
      pSVar7 = STRING_construct_sprintf("PINGRESP");
      log_incoming_trace((MQTT_CLIENT *)context,pSVar7);
      STRING_delete(pSVar7);
    }
    uVar8 = *(undefined8 *)((long)context + 0x38);
    uVar13 = 8;
    puVar11 = (undefined8 *)0x0;
LAB_00112904:
    (**(code **)((long)context + 0x28))(context,uVar13,puVar11,uVar8);
    goto switchD_00112610_caseD_6;
  }
  pcVar6 = *(code **)((long)context + 0x40);
  if (pcVar6 != (code *)0x0) {
    uVar8 = *(undefined8 *)((long)context + 0x48);
    uVar13 = 4;
LAB_001126c2:
    (*pcVar6)(context,uVar13,uVar8);
  }
LAB_001126c4:
  close_connection((MQTT_CLIENT *)context);
switchD_00112610_caseD_6:
  return;
}

Assistant:

static void recvCompleteCallback(void* context, CONTROL_PACKET_TYPE packet, int flags, BUFFER_HANDLE headerData)
{
    MQTT_CLIENT* mqtt_client = (MQTT_CLIENT*)context;
    if (mqtt_client != NULL)
    {
        size_t packetLength = 0;
        uint8_t* iterator = NULL;
        if (headerData != NULL)
        {
            packetLength = BUFFER_length(headerData);
            iterator = BUFFER_u_char(headerData);
        }

#ifdef ENABLE_RAW_TRACE
        logIncomingRawTrace(mqtt_client, packet, (uint8_t)flags, iterator, packetLength);
#endif
        if ((iterator != NULL && packetLength > 0) || packet == PINGRESP_TYPE)
        {
            switch (packet)
            {
                case CONNACK_TYPE:
                {
                    /*Codes_SRS_MQTT_CLIENT_07_028: [If the actionResult parameter is of type CONNECT_ACK then the msgInfo value shall be a CONNECT_ACK structure.]*/
                    CONNECT_ACK connack = { 0 };
                    if (packetLength != 2) // CONNACK payload must be only 2 bytes
                    {
                        LogError("Invalid CONNACK packet.");
                        set_error_callback(mqtt_client, MQTT_CLIENT_COMMUNICATION_ERROR);
                        break;
                    }

                    uint8_t connect_acknowledge_flags = byteutil_readByte(&iterator);
                    if (connect_acknowledge_flags & 0xFE) // bits 7-1 must be zero
                    {
                        LogError("Invalid CONNACK packet.");
                        set_error_callback(mqtt_client, MQTT_CLIENT_COMMUNICATION_ERROR);
                        break;
                    }

                    connack.isSessionPresent = (connect_acknowledge_flags == 0x1) ? true : false;
                    uint8_t rc = byteutil_readByte(&iterator);
                    connack.returnCode =
                        (rc < ((uint8_t)CONN_REFUSED_UNKNOWN)) ?
                        (CONNECT_RETURN_CODE)rc : CONN_REFUSED_UNKNOWN;

#ifndef NO_LOGGING
                    if (is_trace_enabled(mqtt_client))
                    {
                        STRING_HANDLE trace_log = STRING_construct_sprintf("CONNACK | SESSION_PRESENT: %s | RETURN_CODE: 0x%x", connack.isSessionPresent ? TRUE_CONST : FALSE_CONST, connack.returnCode);
                        log_incoming_trace(mqtt_client, trace_log);
                        STRING_delete(trace_log);
                    }
#endif
                    mqtt_client->fnOperationCallback(mqtt_client, MQTT_CLIENT_ON_CONNACK, (void*)&connack, mqtt_client->ctx);

                    if (connack.returnCode == CONNECTION_ACCEPTED)
                    {
                        mqtt_client->mqtt_status |= MQTT_STATUS_CLIENT_CONNECTED;
                    }
                    break;
                }
                case PUBLISH_TYPE:
                {
                    ProcessPublishMessage(mqtt_client, iterator, packetLength, flags);
                    break;
                }
                case PUBACK_TYPE:
                case PUBREC_TYPE:
                case PUBREL_TYPE:
                case PUBCOMP_TYPE:
                {
                    if (packetLength != 2) // PUBXXX payload must be only 2 bytes
                    {
                        LogError("Invalid packet length.");
                        set_error_callback(mqtt_client, MQTT_CLIENT_COMMUNICATION_ERROR);
                        break;
                    }

                    /*Codes_SRS_MQTT_CLIENT_07_029: [If the actionResult parameter are of types PUBACK_TYPE, PUBREC_TYPE, PUBREL_TYPE or PUBCOMP_TYPE then the msgInfo value shall be a PUBLISH_ACK structure.]*/
                    MQTT_CLIENT_EVENT_RESULT action = (packet == PUBACK_TYPE) ? MQTT_CLIENT_ON_PUBLISH_ACK :
                        (packet == PUBREC_TYPE) ? MQTT_CLIENT_ON_PUBLISH_RECV :
                        (packet == PUBREL_TYPE) ? MQTT_CLIENT_ON_PUBLISH_REL : MQTT_CLIENT_ON_PUBLISH_COMP;

                    PUBLISH_ACK publish_ack = { 0 };
                    publish_ack.packetId = byteutil_read_uint16(&iterator, packetLength);

#ifndef NO_LOGGING
                    if (is_trace_enabled(mqtt_client))
                    {
                        STRING_HANDLE trace_log = STRING_construct_sprintf("%s | PACKET_ID: %"PRIu16, packet == PUBACK_TYPE ? "PUBACK" : (packet == PUBREC_TYPE) ? "PUBREC" : (packet == PUBREL_TYPE) ? "PUBREL" : "PUBCOMP",
                            publish_ack.packetId);

                        log_incoming_trace(mqtt_client, trace_log);
                        STRING_delete(trace_log);
                    }
#endif
                    BUFFER_HANDLE pubRel = NULL;
                    mqtt_client->fnOperationCallback(mqtt_client, action, (void*)&publish_ack, mqtt_client->ctx);
                    if (packet == PUBREC_TYPE)
                    {
                        pubRel = mqtt_codec_publishRelease(publish_ack.packetId);
                        if (pubRel == NULL)
                        {
                            LogError("Failed to allocate publish release message.");
                            set_error_callback(mqtt_client, MQTT_CLIENT_MEMORY_ERROR);
                        }
                    }
                    else if (packet == PUBREL_TYPE)
                    {
                        pubRel = mqtt_codec_publishComplete(publish_ack.packetId);
                        if (pubRel == NULL)
                        {
                            LogError("Failed to allocate publish complete message.");
                            set_error_callback(mqtt_client, MQTT_CLIENT_MEMORY_ERROR);
                        }
                    }
                    if (pubRel != NULL)
                    {
                        size_t size = BUFFER_length(pubRel);
                        if (sendPacketItem(mqtt_client, BUFFER_u_char(pubRel), size) != 0)
                        {
                            LogError("Failed sending publish reply.");
                            set_error_callback(mqtt_client, MQTT_CLIENT_COMMUNICATION_ERROR);
                        }
                        BUFFER_delete(pubRel);
                    }
                    break;
                }
                case SUBACK_TYPE:
                {

                    /*Codes_SRS_MQTT_CLIENT_07_030: [If the actionResult parameter is of type SUBACK_TYPE then the msgInfo value shall be a SUBSCRIBE_ACK structure.]*/
                    SUBSCRIBE_ACK suback = { 0 };

                    size_t remainLen = packetLength;
                    suback.packetId = byteutil_read_uint16(&iterator, packetLength);
                    remainLen -= 2;

#ifndef NO_LOGGING
                    STRING_HANDLE trace_log = NULL;
                    if (is_trace_enabled(mqtt_client))
                    {
                        trace_log = STRING_construct_sprintf("SUBACK | PACKET_ID: %"PRIu16, suback.packetId);
                    }
#endif
                    // Allocate the remaining len
                    size_t malloc_size = safe_multiply_size_t(sizeof(QOS_VALUE), remainLen);
                    if (malloc_size != SIZE_MAX && 
                        (suback.qosReturn = (QOS_VALUE*)malloc(malloc_size)) != NULL)
                    {
                        while (remainLen > 0)
                        {
                            uint8_t qosRet = byteutil_readByte(&iterator);
                            if (qosRet & 0x7C) // SUBACK QOS bits 6-2 must be zero
                            {
                                LogError("Invalid SUBACK_TYPE packet.");
                                set_error_callback(mqtt_client, MQTT_CLIENT_COMMUNICATION_ERROR);
                                break;
                            }
                            suback.qosReturn[suback.qosCount++] =
                                (qosRet <= ((uint8_t)DELIVER_EXACTLY_ONCE)) ?
                                (QOS_VALUE)qosRet :  DELIVER_FAILURE;
                            remainLen--;
#ifndef NO_LOGGING
                            if (is_trace_enabled(mqtt_client))
                            {
                                STRING_sprintf(trace_log, " | RETURN_CODE: %"PRIu16, suback.qosReturn[suback.qosCount-1]);
                            }
#endif
                        }

#ifndef NO_LOGGING
                        if (is_trace_enabled(mqtt_client))
                        {
                            log_incoming_trace(mqtt_client, trace_log);
                            STRING_delete(trace_log);
                        }
#endif
                        mqtt_client->fnOperationCallback(mqtt_client, MQTT_CLIENT_ON_SUBSCRIBE_ACK, (void*)&suback, mqtt_client->ctx);
                        free(suback.qosReturn);
                    }
                    else
                    {
                        LogError("allocation of quality of service value failed, size:%zu", malloc_size);
                        set_error_callback(mqtt_client, MQTT_CLIENT_MEMORY_ERROR);
                    }
                    break;
                }
                case UNSUBACK_TYPE:
                {
                    /*Codes_SRS_MQTT_CLIENT_07_031: [If the actionResult parameter is of type UNSUBACK_TYPE then the msgInfo value shall be a UNSUBSCRIBE_ACK structure.]*/
                    UNSUBSCRIBE_ACK unsuback = { 0 };
                    if (packetLength != 2) // UNSUBACK_TYPE payload must be only 2 bytes
                    {
                        LogError("Invalid UNSUBACK packet length.");
                        set_error_callback(mqtt_client, MQTT_CLIENT_COMMUNICATION_ERROR);
                        break;
                    }

                    unsuback.packetId = byteutil_read_uint16(&iterator, packetLength);

#ifndef NO_LOGGING
                    if (is_trace_enabled(mqtt_client))
                    {
                        STRING_HANDLE trace_log = STRING_construct_sprintf("UNSUBACK | PACKET_ID: %"PRIu16, unsuback.packetId);
                        log_incoming_trace(mqtt_client, trace_log);
                        STRING_delete(trace_log);
                    }
#endif
                    mqtt_client->fnOperationCallback(mqtt_client, MQTT_CLIENT_ON_UNSUBSCRIBE_ACK, (void*)&unsuback, mqtt_client->ctx);
                    break;
                }
                case PINGRESP_TYPE:
                    mqtt_client->timeSincePing = 0;
#ifndef NO_LOGGING
                    if (is_trace_enabled(mqtt_client))
                    {
                        STRING_HANDLE trace_log = STRING_construct_sprintf("PINGRESP");
                        log_incoming_trace(mqtt_client, trace_log);
                        STRING_delete(trace_log);
                    }
#endif
                    // Forward ping response to operation callback
                    mqtt_client->fnOperationCallback(mqtt_client, MQTT_CLIENT_ON_PING_RESPONSE, NULL, mqtt_client->ctx);
                    break;
                default:
                    break;
            }
        }
    }
    else
    {
        LogError("recvCompleteCallback context failed.");
    }
}